

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector3.cpp
# Opt level: O2

ostream * operator<<(ostream *os,Vector3 *vector)

{
  ostream *poVar1;
  
  std::operator<<(os,"(");
  poVar1 = std::ostream::_M_insert<double>(vector->x);
  std::operator<<(poVar1,",");
  poVar1 = std::ostream::_M_insert<double>(vector->y);
  std::operator<<(poVar1,",");
  poVar1 = std::ostream::_M_insert<double>(vector->z);
  std::operator<<(poVar1,")");
  return os;
}

Assistant:

std::ostream &operator<<(std::ostream &os, const Vector3 &vector) {
    os << "(" << vector.x << "," << vector.y << "," << vector.z << ")";
    return os;
}